

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metropolis2.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  time_t tVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double metropolis;
  double action_fin;
  double dy;
  double dx;
  double action_init;
  double backup_y;
  double backup_x;
  int iter;
  int naccept;
  double y;
  double x;
  double step_size_y;
  double step_size_x;
  int niter;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  y = 0.0;
  _iter = 0.0;
  backup_x._4_4_ = 0;
  for (backup_x._0_4_ = 1; backup_x._0_4_ < 0x2711; backup_x._0_4_ = backup_x._0_4_ + 1) {
    iVar1 = rand();
    iVar2 = rand();
    dVar4 = ((double)iVar1 / 2147483647.0 - 0.5) * 0.5 * 2.0 + y;
    dVar5 = ((double)iVar2 / 2147483647.0 - 0.5) * 0.5 * 2.0 + _iter;
    iVar1 = rand();
    dVar6 = exp((y * _iter + y * y + _iter * _iter) * 0.5 -
                (dVar4 * dVar5 + dVar4 * dVar4 + dVar5 * dVar5) * 0.5);
    if ((double)iVar1 / 2147483647.0 < dVar6) {
      backup_x._4_4_ = backup_x._4_4_ + 1;
      _iter = dVar5;
      y = dVar4;
    }
    if (backup_x._0_4_ % 10 == 0) {
      printf("%.10f\t%.10f\t%f\n",y,_iter,(double)backup_x._4_4_ / (double)backup_x._0_4_);
    }
  }
  return 0;
}

Assistant:

int main(void) {
    int niter = 10000; // サンプルの数
    double step_size_x = 0.5e0;
    double step_size_y = 0.5e0;

    srand((unsigned) time(nullptr));

    double x = 0e0;
    double y = 0e0;
    int naccept = 0; // 受理回数カウンター

    for (int iter = 1; iter < niter + 1; iter++) {
        double backup_x = x;
        double backup_y = y;
        double action_init = 0.5e0 * (x * x + y * y + x * y);

        double dx = (double) rand() / RAND_MAX;
        double dy = (double) rand() / RAND_MAX;
        dx = (dx - 0.5e0) * step_size_x * 2e0;
        dy = (dy - 0.5e0) * step_size_y * 2e0;
        x += dx;
        y += dy;

        double action_fin = 0.5e0 * (x * x + y * y + x * y);

        // メトロポリステスト
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(action_init - action_fin) > metropolis) {
            // 受理
            naccept++;
        } else {
            // 棄却して元に戻す
            x = backup_x;
            y = backup_y;
        }
        if (iter % 10 == 0) {
            printf("%.10f\t%.10f\t%f\n", x, y, (double) naccept / iter);
        }
    }
}